

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepscheduler_kba.c
# Opt level: O2

Bool_t StepScheduler_must_do_recv
                 (StepScheduler *stepscheduler,int step,int axis,int dir_ind,int octant_in_block,
                 Env *env)

{
  int proc_x;
  int proc_y;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  StepInfo SVar4;
  StepInfo SVar5;
  uint local_48;
  
  proc_x = Env_proc_x_this(env);
  proc_y = Env_proc_y_this(env);
  uVar2 = 0;
  uVar1 = -(uint)(dir_ind != 0) | 1;
  uVar3 = 0;
  if (axis == 1) {
    uVar3 = uVar1;
  }
  local_48 = 0;
  if (axis == 0) {
    uVar3 = 0;
    uVar2 = uVar1;
  }
  SVar4 = StepScheduler_stepinfo(stepscheduler,step,octant_in_block,proc_x - uVar2,proc_y - uVar3);
  SVar5 = StepScheduler_stepinfo(stepscheduler,step + 1,octant_in_block,proc_x,proc_y);
  if ((SVar5.is_active != 0 && SVar4.is_active != 0) &&
     (SVar4.block_z == SVar5.block_z && SVar4.octant == SVar5.octant)) {
    local_48 = (uint)(((2 - (axis == 0) & SVar5.octant) != 0) != (dir_ind == 0));
  }
  return local_48;
}

Assistant:

Bool_t StepScheduler_must_do_recv(
  StepScheduler* stepscheduler,
  int            step,
  int            axis,
  int            dir_ind,
  int            octant_in_block,
  Env*           env )
{
  const int proc_x = Env_proc_x_this( env );
  const int proc_y = Env_proc_y_this( env );

  const Bool_t axis_x = axis==0;
  const Bool_t axis_y = axis==1;

  const int dir = dir_ind==0 ? (int)DIR_UP : (int)DIR_DN;
  const int inc_x = axis_x ? Dir_inc( dir ) : 0;
  const int inc_y = axis_y ? Dir_inc( dir ) : 0;

  /*---Get step info for processors involved in communication---*/

  const StepInfo stepinfo_recv_source_step = StepScheduler_stepinfo(
    stepscheduler, step,   octant_in_block, proc_x-inc_x, proc_y-inc_y );

  const StepInfo stepinfo_recv_target_step = StepScheduler_stepinfo(
    stepscheduler, step+1, octant_in_block, proc_x,       proc_y       );

  /*---Determine whether to communicate---*/

  Bool_t const do_recv = stepinfo_recv_source_step.is_active
                      && stepinfo_recv_target_step.is_active
                      && stepinfo_recv_source_step.octant ==
                         stepinfo_recv_target_step.octant
                      && stepinfo_recv_source_step.block_z ==
                         stepinfo_recv_target_step.block_z
                      && ( axis_x ?
                           Dir_x( stepinfo_recv_target_step.octant ) :
                           Dir_y( stepinfo_recv_target_step.octant ) ) == dir;

  return do_recv;
}